

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O0

vector<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_> *
pbrt::
returnArray<pbrt::SpectrumHandle,pstd::vector<std::__cxx11::string,pstd::pmr::polymorphic_allocator<std::__cxx11::string>>,pbrt::ParameterDictionary::extractSpectrumArray(pbrt::ParsedParameter_const&,pbrt::SpectrumType,pstd::pmr::polymorphic_allocator<std::byte>)const::__3>
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *values,ParsedParameter *param,int nPerItem,anon_class_216_2_272f9d75 *convert)

{
  bool bVar1;
  size_t sVar2;
  SpectrumHandle *this;
  const_reference pvVar3;
  int in_ECX;
  long in_RDX;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RSI;
  string *in_RDI;
  allocator_type *in_R8;
  size_t i;
  size_t n;
  vector<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_> *v;
  string *s;
  anon_class_216_2_272f9d75 *in_stack_ffffffffffffffa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  SpectrumHandle *__n;
  int *in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  undefined7 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffcf;
  FileLoc *in_stack_ffffffffffffffd0;
  SpectrumHandle *pSVar4;
  
  s = in_RDI;
  bVar1 = pstd::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)0x74e65e);
  if (bVar1) {
    ErrorExit<std::__cxx11::string_const&>
              ((FileLoc *)in_stack_ffffffffffffffc0,(char *)in_stack_ffffffffffffffb8,
               in_stack_ffffffffffffffb0);
  }
  sVar2 = pstd::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(in_RSI);
  if (sVar2 % (ulong)(long)in_ECX == 0) {
    *(undefined1 *)(in_RDX + 0xb8) = 1;
    sVar2 = pstd::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(in_RSI);
    this = (SpectrumHandle *)(sVar2 / (ulong)(long)in_ECX);
    pSVar4 = this;
    std::allocator<pbrt::SpectrumHandle>::allocator((allocator<pbrt::SpectrumHandle> *)0x74e702);
    std::vector<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>::vector
              ((vector<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_> *)s,
               (size_type)in_RDI,in_R8);
    std::allocator<pbrt::SpectrumHandle>::~allocator((allocator<pbrt::SpectrumHandle> *)0x74e722);
    for (__n = (SpectrumHandle *)0x0; __n < pSVar4;
        __n = (SpectrumHandle *)
              ((long)&(__n->
                      super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
                      ).bits + 1)) {
      pvVar3 = pstd::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](in_RSI,(long)in_ECX * (long)__n);
      ParameterDictionary::extractSpectrumArray::anon_class_216_2_272f9d75::operator()
                (in_stack_ffffffffffffffa8,s,(FileLoc *)in_RDI);
      std::vector<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>::operator[]
                ((vector<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_> *)in_RDI,
                 (size_type)__n);
      SpectrumHandle::operator=(this,(SpectrumHandle *)pvVar3);
    }
    return (vector<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_> *)s;
  }
  ErrorExit<std::__cxx11::string_const&,int&>
            (in_stack_ffffffffffffffd0,
             (char *)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8),
             in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
}

Assistant:

static std::vector<ReturnType> returnArray(const ValuesType &values,
                                           const ParsedParameter &param, int nPerItem,
                                           C convert) {
    if (values.empty())
        ErrorExit(&param.loc, "No values provided for \"%s\".", param.name);
    if (values.size() % nPerItem)
        ErrorExit(&param.loc, "Number of values provided for \"%s\" not a multiple of %d",
                  param.name, nPerItem);

    param.lookedUp = true;
    size_t n = values.size() / nPerItem;
    std::vector<ReturnType> v(n);
    for (size_t i = 0; i < n; ++i)
        v[i] = convert(&values[nPerItem * i], &param.loc);
    return v;
}